

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackstring.hpp
# Opt level: O2

void __thiscall
StackString<32UL,_char>::ReallocateBuffer(StackString<32UL,_char> *this,SIZE_T count)

{
  char *pcVar1;
  
  pcVar1 = (char *)PAL_malloc(count + 1);
  if (pcVar1 == (char *)0x0) {
    SetLastError(8);
    DeleteBuffer(this);
    count = 0;
  }
  else {
    DeleteBuffer(this);
    this->m_buffer = pcVar1;
    this->m_size = count + 1;
  }
  this->m_count = count;
  return;
}

Assistant:

void ReallocateBuffer(SIZE_T count)
    {
        // count is always > STACKCOUNT here.
        T * newBuffer = (T *)PAL_malloc((count + 1) * sizeof(T));
        if (NULL == newBuffer)
        {
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);

            DeleteBuffer();
            m_count = 0;

            return;
        }

        DeleteBuffer();
        m_buffer = newBuffer;
        m_count = count;
        m_size = count+1;

        return;
    }